

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_msl.cpp
# Opt level: O1

void __thiscall
spirv_cross::CompilerMSL::emit_array_copy
          (CompilerMSL *this,string *lhs,uint32_t rhs_id,StorageClass lhs_storage,
          StorageClass rhs_storage)

{
  Variant *pVVar1;
  ulong uVar2;
  string *ts_4;
  byte bVar3;
  SPVFuncImpl spv_func;
  SPIRVariable *pSVar4;
  runtime_error *prVar5;
  byte bVar6;
  byte bVar7;
  byte bVar8;
  bool bVar9;
  char *tag;
  byte local_79;
  string *local_78;
  StorageClass local_6c;
  SPIRType *local_68;
  string local_60;
  StorageClass local_3c;
  size_t local_38;
  
  bVar6 = (byte)(0x1c8 >> ((byte)lhs_storage & 0x1f)) & lhs_storage < StorageClassPushConstant;
  bVar8 = (byte)(0x1c2 >> ((byte)rhs_storage & 0x1f)) & rhs_storage < StorageClassPushConstant;
  bVar7 = bVar6 ^ 1;
  bVar3 = bVar8 ^ 1;
  local_78 = lhs;
  if (((bVar7 == 0 && bVar3 == 0) && ((this->msl_options).force_native_arrays == false)) &&
     ((this->is_using_builtin_array & 1U) == 0)) {
    CompilerGLSL::to_expression_abi_cxx11_(&local_60,&this->super_CompilerGLSL,rhs_id,true);
    CompilerGLSL::
    statement<std::__cxx11::string_const&,char_const(&)[4],std::__cxx11::string,char_const(&)[2]>
              (&this->super_CompilerGLSL,local_78,(char (*) [4])0x2f7937,&local_60,
               (char (*) [2])0x2ddbde);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_60._M_dataplus._M_p == &local_60.field_2) {
      return;
    }
  }
  else {
    local_79 = bVar3;
    local_6c = rhs_storage;
    local_3c = lhs_storage;
    local_68 = Compiler::expression_type((Compiler *)this,rhs_id);
    pSVar4 = Compiler::maybe_get_backing_variable((Compiler *)this,rhs_id);
    pVVar1 = (this->super_CompilerGLSL).super_Compiler.ir.ids.super_VectorView<spirv_cross::Variant>
             .ptr;
    if ((pVVar1[rhs_id].type == TypeConstant) ||
       (((pSVar4 != (SPIRVariable *)0x0 && (pSVar4->remapped_variable == true)) &&
        ((pSVar4->statically_assigned == true &&
         (pVVar1[(pSVar4->static_expression).id].type == TypeConstant)))))) {
      bVar9 = false;
    }
    else {
      bVar9 = local_6c != StorageClassUniform;
    }
    uVar2 = (local_68->array).super_VectorView<unsigned_int>.buffer_size;
    spv_func = SPVFuncImplArrayCopy;
    if (1 < uVar2) {
      if (6 < uVar2) {
        prVar5 = (runtime_error *)__cxa_allocate_exception(0x10);
        local_60._M_dataplus._M_p = (pointer)&local_60.field_2;
        ::std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_60,"Cannot support this many dimensions for arrays of arrays.",
                   "");
        ::std::runtime_error::runtime_error(prVar5,(string *)&local_60);
        *(undefined ***)prVar5 = &PTR__runtime_error_0035b0b8;
        __cxa_throw(prVar5,&CompilerError::typeinfo,::std::runtime_error::~runtime_error);
      }
      spv_func = (SPVFuncImpl)uVar2 | SPVFuncImplArrayCopyMultidimBase;
    }
    add_spv_func_and_recompile(this,spv_func);
    ts_4 = local_78;
    tag = (char *)0x0;
    if (bVar9 || bVar7 != 0) {
      if (!bVar9 && local_3c == StorageClassWorkgroup) {
        tag = "FromConstantToThreadGroup";
      }
      else if (bVar7 == 0 && bVar3 == 0) {
        tag = "FromStackToStack";
      }
      else if (local_3c == StorageClassWorkgroup && local_79 == 0) {
        tag = "FromStackToThreadGroup";
      }
      else if (local_6c == StorageClassWorkgroup && bVar7 == 0) {
        tag = "FromThreadGroupToStack";
      }
      else if ((local_3c ^ StorageClassWorkgroup) == StorageClassUniformConstant &&
               (local_6c ^ StorageClassWorkgroup) == StorageClassUniformConstant) {
        tag = "FromThreadGroupToThreadGroup";
      }
      else if ((local_3c ^ StorageClassStorageBuffer) == StorageClassUniformConstant &&
               (local_6c ^ StorageClassStorageBuffer) == StorageClassUniformConstant) {
        tag = "FromDeviceToDevice";
      }
      else if (!bVar9 && local_3c == StorageClassStorageBuffer) {
        tag = "FromConstantToDevice";
      }
      else if ((local_3c ^ StorageClassStorageBuffer) == StorageClassUniformConstant &&
               (local_6c ^ StorageClassWorkgroup) == StorageClassUniformConstant) {
        tag = "FromThreadGroupToDevice";
      }
      else if (local_3c == StorageClassStorageBuffer && local_79 == 0) {
        tag = "FromStackToDevice";
      }
      else if ((local_3c ^ StorageClassWorkgroup) == StorageClassUniformConstant &&
               (local_6c ^ StorageClassStorageBuffer) == StorageClassUniformConstant) {
        tag = "FromDeviceToThreadGroup";
      }
      else {
        if (local_6c != StorageClassStorageBuffer || bVar7 != 0) {
          prVar5 = (runtime_error *)__cxa_allocate_exception(0x10);
          local_60._M_dataplus._M_p = (pointer)&local_60.field_2;
          ::std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_60,"Unknown storage class used for copying arrays.","");
          ::std::runtime_error::runtime_error(prVar5,(string *)&local_60);
          *(undefined ***)prVar5 = &PTR__runtime_error_0035b0b8;
          __cxa_throw(prVar5,&CompilerError::typeinfo,::std::runtime_error::~runtime_error);
        }
        tag = "FromDeviceToStack";
      }
    }
    else {
      tag = "FromConstantToStack";
    }
    if ((bVar6 == 0) || ((this->msl_options).force_native_arrays != false)) {
      if ((bVar8 == 0) || ((this->msl_options).force_native_arrays != false)) {
        local_38 = (local_68->array).super_VectorView<unsigned_int>.buffer_size;
        CompilerGLSL::to_expression_abi_cxx11_(&local_60,&this->super_CompilerGLSL,rhs_id,true);
        CompilerGLSL::
        statement<char_const(&)[13],char_const*&,unsigned_long,char_const(&)[2],std::__cxx11::string_const&,char_const(&)[3],std::__cxx11::string,char_const(&)[3]>
                  (&this->super_CompilerGLSL,(char (*) [13])0x2ee138,&tag,&local_38,
                   (char (*) [2])0x2f8011,ts_4,(char (*) [3])0x2f4768,&local_60,
                   (char (*) [3])0x2ddbdd);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_60._M_dataplus._M_p == &local_60.field_2) {
          return;
        }
      }
      else {
        local_38 = (local_68->array).super_VectorView<unsigned_int>.buffer_size;
        CompilerGLSL::to_expression_abi_cxx11_(&local_60,&this->super_CompilerGLSL,rhs_id,true);
        CompilerGLSL::
        statement<char_const(&)[13],char_const*&,unsigned_long,char_const(&)[2],std::__cxx11::string_const&,char_const(&)[3],std::__cxx11::string,char_const(&)[12]>
                  (&this->super_CompilerGLSL,(char (*) [13])0x2ee138,&tag,&local_38,
                   (char (*) [2])0x2f8011,ts_4,(char (*) [3])0x2f4768,&local_60,
                   (char (*) [12])".elements);");
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_60._M_dataplus._M_p == &local_60.field_2) {
          return;
        }
      }
    }
    else {
      local_38 = (local_68->array).super_VectorView<unsigned_int>.buffer_size;
      CompilerGLSL::to_expression_abi_cxx11_(&local_60,&this->super_CompilerGLSL,rhs_id,true);
      CompilerGLSL::
      statement<char_const(&)[13],char_const*&,unsigned_long,char_const(&)[2],std::__cxx11::string_const&,char_const(&)[12],std::__cxx11::string,char_const(&)[3]>
                (&this->super_CompilerGLSL,(char (*) [13])0x2ee138,&tag,&local_38,
                 (char (*) [2])0x2f8011,ts_4,(char (*) [12])".elements, ",&local_60,
                 (char (*) [3])0x2ddbdd);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_60._M_dataplus._M_p == &local_60.field_2) {
        return;
      }
    }
  }
  operator_delete(local_60._M_dataplus._M_p);
  return;
}

Assistant:

void CompilerMSL::emit_array_copy(const string &lhs, uint32_t rhs_id, StorageClass lhs_storage,
                                  StorageClass rhs_storage)
{
	// Allow Metal to use the array<T> template to make arrays a value type.
	// This, however, cannot be used for threadgroup address specifiers, so consider the custom array copy as fallback.
	bool lhs_thread = (lhs_storage == StorageClassOutput || lhs_storage == StorageClassFunction ||
	                   lhs_storage == StorageClassGeneric || lhs_storage == StorageClassPrivate);
	bool rhs_thread = (rhs_storage == StorageClassInput || rhs_storage == StorageClassFunction ||
	                   rhs_storage == StorageClassGeneric || rhs_storage == StorageClassPrivate);

	// If threadgroup storage qualifiers are *not* used:
	// Avoid spvCopy* wrapper functions; Otherwise, spvUnsafeArray<> template cannot be used with that storage qualifier.
	if (lhs_thread && rhs_thread && !using_builtin_array())
	{
		statement(lhs, " = ", to_expression(rhs_id), ";");
	}
	else
	{
		// Assignment from an array initializer is fine.
		auto &type = expression_type(rhs_id);
		auto *var = maybe_get_backing_variable(rhs_id);

		// Unfortunately, we cannot template on address space in MSL,
		// so explicit address space redirection it is ...
		bool is_constant = false;
		if (ir.ids[rhs_id].get_type() == TypeConstant)
		{
			is_constant = true;
		}
		else if (var && var->remapped_variable && var->statically_assigned &&
		         ir.ids[var->static_expression].get_type() == TypeConstant)
		{
			is_constant = true;
		}
		else if (rhs_storage == StorageClassUniform)
		{
			is_constant = true;
		}

		// For the case where we have OpLoad triggering an array copy,
		// we cannot easily detect this case ahead of time since it's
		// context dependent. We might have to force a recompile here
		// if this is the only use of array copies in our shader.
		if (type.array.size() > 1)
		{
			if (type.array.size() > kArrayCopyMultidimMax)
				SPIRV_CROSS_THROW("Cannot support this many dimensions for arrays of arrays.");
			auto func = static_cast<SPVFuncImpl>(SPVFuncImplArrayCopyMultidimBase + type.array.size());
			add_spv_func_and_recompile(func);
		}
		else
			add_spv_func_and_recompile(SPVFuncImplArrayCopy);

		const char *tag = nullptr;
		if (lhs_thread && is_constant)
			tag = "FromConstantToStack";
		else if (lhs_storage == StorageClassWorkgroup && is_constant)
			tag = "FromConstantToThreadGroup";
		else if (lhs_thread && rhs_thread)
			tag = "FromStackToStack";
		else if (lhs_storage == StorageClassWorkgroup && rhs_thread)
			tag = "FromStackToThreadGroup";
		else if (lhs_thread && rhs_storage == StorageClassWorkgroup)
			tag = "FromThreadGroupToStack";
		else if (lhs_storage == StorageClassWorkgroup && rhs_storage == StorageClassWorkgroup)
			tag = "FromThreadGroupToThreadGroup";
		else if (lhs_storage == StorageClassStorageBuffer && rhs_storage == StorageClassStorageBuffer)
			tag = "FromDeviceToDevice";
		else if (lhs_storage == StorageClassStorageBuffer && is_constant)
			tag = "FromConstantToDevice";
		else if (lhs_storage == StorageClassStorageBuffer && rhs_storage == StorageClassWorkgroup)
			tag = "FromThreadGroupToDevice";
		else if (lhs_storage == StorageClassStorageBuffer && rhs_thread)
			tag = "FromStackToDevice";
		else if (lhs_storage == StorageClassWorkgroup && rhs_storage == StorageClassStorageBuffer)
			tag = "FromDeviceToThreadGroup";
		else if (lhs_thread && rhs_storage == StorageClassStorageBuffer)
			tag = "FromDeviceToStack";
		else
			SPIRV_CROSS_THROW("Unknown storage class used for copying arrays.");

		// Pass internal array of spvUnsafeArray<> into wrapper functions
		if (lhs_thread && !msl_options.force_native_arrays)
			statement("spvArrayCopy", tag, type.array.size(), "(", lhs, ".elements, ", to_expression(rhs_id), ");");
		else if (rhs_thread && !msl_options.force_native_arrays)
			statement("spvArrayCopy", tag, type.array.size(), "(", lhs, ", ", to_expression(rhs_id), ".elements);");
		else
			statement("spvArrayCopy", tag, type.array.size(), "(", lhs, ", ", to_expression(rhs_id), ");");
	}
}